

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_surf(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  REF_GLOB n_global;
  char *pcVar10;
  ulong global;
  REF_INT new_node;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT dummy;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_DBL xyz [3];
  char buffer [1024];
  uint local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  undefined1 local_4d4 [4];
  int local_4d0;
  int local_4cc;
  REF_DBL local_4c8;
  REF_DBL local_4c0;
  REF_DBL local_4b8;
  REF_CELL local_4b0;
  undefined8 local_4a8;
  int iStack_4a0;
  int iStack_49c;
  undefined4 local_498;
  char local_438 [1032];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x192,"ref_import_surf","unable to open file");
      return 2;
    }
    iVar5 = __isoc99_fscanf(__stream,"%d",&local_4dc);
    if (iVar5 == 1) {
      iVar5 = __isoc99_fscanf(__stream,"%d",&local_4e0);
      if (iVar5 == 1) {
        iVar5 = __isoc99_fscanf(__stream,"%d",&local_4d8);
        if (iVar5 == 1) {
          n_global = (REF_GLOB)local_4d8;
          if (0 < n_global) {
            global = 0;
            do {
              uVar4 = ref_node_add(ref_node,global,(REF_INT *)&local_4e4);
              if (uVar4 != 0) {
                pcVar10 = "new_node";
                uVar8 = 0x199;
                goto LAB_0015f14b;
              }
              if (global != local_4e4) {
                pcVar10 = "node index";
                uVar8 = 0x19a;
                goto LAB_0015f39c;
              }
              iVar5 = __isoc99_fscanf(__stream,"%lf",&local_4c8);
              if (iVar5 != 1) {
                pcVar10 = "x";
                uVar8 = 0x19b;
                goto LAB_0015f39c;
              }
              iVar5 = __isoc99_fscanf(__stream,"%lf",&local_4c0);
              if (iVar5 != 1) {
                pcVar10 = "y";
                uVar8 = 0x19c;
                goto LAB_0015f39c;
              }
              iVar5 = __isoc99_fscanf(__stream,"%lf",&local_4b8);
              if (iVar5 != 1) {
                pcVar10 = "z";
                uVar8 = 0x19d;
                goto LAB_0015f39c;
              }
              pRVar2 = ref_node->real;
              lVar7 = (long)(int)local_4e4;
              pRVar2[lVar7 * 0xf] = local_4c8;
              pRVar2[lVar7 * 0xf + 1] = local_4c0;
              pRVar2[lVar7 * 0xf + 2] = local_4b8;
              fgets(local_438,0x400,__stream);
              global = global + 1;
              n_global = (REF_GLOB)local_4d8;
            } while ((long)global < n_global);
          }
          uVar4 = ref_node_initialize_n_global(ref_node,n_global);
          if (uVar4 == 0) {
            local_4b0 = pRVar1->cell[3];
            iStack_49c = -1;
            if (0 < local_4dc) {
              iVar5 = 0;
              do {
                lVar7 = 0;
                do {
                  iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_4a8 + lVar7);
                  if (iVar6 != 1) {
                    pcVar10 = "tri";
                    uVar8 = 0x1aa;
                    goto LAB_0015f39c;
                  }
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0x10);
                bVar3 = true;
                do {
                  bVar9 = bVar3;
                  iVar6 = __isoc99_fscanf(__stream,"%d",local_4d4);
                  if (iVar6 != 1) {
                    pcVar10 = "extra 0 1";
                    uVar8 = 0x1ac;
                    goto LAB_0015f39c;
                  }
                  bVar3 = false;
                } while (bVar9);
                local_4a8 = CONCAT44((int)((ulong)local_4a8 >> 0x20) + -1,(int)local_4a8 + -1);
                iStack_4a0 = iStack_4a0 + -1;
                uVar4 = ref_cell_add(local_4b0,(REF_INT *)&local_4a8,&local_4cc);
                if (uVar4 != 0) {
                  pcVar10 = "new tri";
                  uVar8 = 0x1b0;
                  goto LAB_0015f14b;
                }
                if (iVar5 != local_4cc) {
                  pcVar10 = "tri index";
                  uVar8 = 0x1b1;
                  goto LAB_0015f39c;
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 < local_4dc);
            }
            ref_cell = pRVar1->cell[6];
            local_498 = 0xffffffff;
            if (0 < local_4e0) {
              iVar5 = 0;
              do {
                lVar7 = 0;
                do {
                  iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_4a8 + lVar7);
                  if (iVar6 != 1) {
                    pcVar10 = "qua";
                    uVar8 = 0x1b8;
                    goto LAB_0015f39c;
                  }
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0x14);
                bVar3 = true;
                do {
                  bVar9 = bVar3;
                  iVar6 = __isoc99_fscanf(__stream,"%d",local_4d4);
                  if (iVar6 != 1) {
                    pcVar10 = "extra 0 1";
                    uVar8 = 0x1ba;
                    goto LAB_0015f39c;
                  }
                  bVar3 = false;
                } while (bVar9);
                iStack_4a0 = iStack_4a0 + -1;
                iStack_49c = iStack_49c + -1;
                local_4a8 = CONCAT44(local_4a8._4_4_ + -1,(int)local_4a8 + -1);
                uVar4 = ref_cell_add(ref_cell,(REF_INT *)&local_4a8,&local_4d0);
                if (uVar4 != 0) {
                  pcVar10 = "new qua";
                  uVar8 = 0x1bf;
                  goto LAB_0015f14b;
                }
                if (iVar5 != local_4d0) {
                  pcVar10 = "qua index";
                  uVar8 = 0x1c0;
                  goto LAB_0015f39c;
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 < local_4e0);
            }
            fclose(__stream);
            return 0;
          }
          pcVar10 = "init glob";
          uVar8 = 0x1a4;
          goto LAB_0015f14b;
        }
        pcVar10 = "nnode";
        uVar8 = 0x196;
      }
      else {
        pcVar10 = "nqua";
        uVar8 = 0x195;
      }
    }
    else {
      pcVar10 = "ntri";
      uVar8 = 0x194;
    }
LAB_0015f39c:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
           "ref_import_surf",pcVar10);
    uVar4 = 1;
  }
  else {
    pcVar10 = "create grid";
    uVar8 = 0x18c;
LAB_0015f14b:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
           "ref_import_surf",(ulong)uVar4,pcVar10);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_import_surf(REF_GRID *ref_grid_ptr,
                                          REF_MPI ref_mpi,
                                          const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua;
  REF_INT node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua, new_qua;
  REF_INT dummy;
  char buffer[1024];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &nnode), "nnode");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
    fgets(buffer, sizeof(buffer), file);
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    for (node = 0; node < 2; node++)
      RES(1, fscanf(file, "%d", &(dummy)), "extra 0 1");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 5; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
    for (node = 0; node < 2; node++)
      RES(1, fscanf(file, "%d", &(dummy)), "extra 0 1");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  fclose(file);

  return REF_SUCCESS;
}